

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

void __thiscall flatbuffers::Parser::ParseEnum(Parser *this,bool is_union)

{
  _Rb_tree_header *p_Var1;
  Type *type;
  pointer pcVar2;
  pointer ppEVar3;
  pointer ppEVar4;
  bool bVar5;
  EnumDef *e;
  EnumVal *pEVar6;
  StructDef *pSVar7;
  undefined8 extraout_RAX;
  int iVar8;
  string name_1;
  string dc_1;
  string name;
  string dc;
  undefined1 local_d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  undefined1 local_a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  char local_88 [16];
  SymbolTable<flatbuffers::EnumVal> *local_78;
  undefined1 local_70 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  Value *local_40 [2];
  
  local_50._M_allocated_capacity = (size_type)local_40;
  pcVar2 = (this->doc_comment_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + (this->doc_comment_)._M_string_length);
  Next(this);
  local_98._M_allocated_capacity = (size_type)local_88;
  pcVar2 = (this->attribute_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar2,pcVar2 + (this->attribute_)._M_string_length);
  Expect(this,4);
  e = (EnumDef *)operator_new(0xf8);
  (e->super_Definition).name._M_dataplus._M_p = (pointer)&(e->super_Definition).name.field_2;
  (e->super_Definition).name._M_string_length = 0;
  (e->super_Definition).name.field_2._M_local_buf[0] = '\0';
  (e->super_Definition).doc_comment._M_dataplus._M_p =
       (pointer)&(e->super_Definition).doc_comment.field_2;
  (e->super_Definition).doc_comment._M_string_length = 0;
  (e->super_Definition).doc_comment.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header;
  (e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header + 0x10
   ) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_header + 0x18
   ) = p_Var1;
  (e->super_Definition).attributes.dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (e->super_Definition).attributes.vec.
  super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (e->super_Definition).attributes.vec.
  super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (e->super_Definition).attributes.vec.
  super__Vector_base<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (e->super_Definition).generated = false;
  p_Var1 = &(e->vals).dict._M_t._M_impl.super__Rb_tree_header;
  (e->vals).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (e->vals).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (e->vals).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (e->vals).dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (e->vals).dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (e->vals).vec.super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (e->vals).vec.super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (e->vals).vec.super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  e->is_union = false;
  (e->underlying_type).enum_def = (EnumDef *)0x0;
  (e->underlying_type).base_type = BASE_TYPE_NONE;
  (e->underlying_type).element = BASE_TYPE_NONE;
  (e->underlying_type).struct_def = (StructDef *)0x0;
  std::__cxx11::string::_M_assign((string *)e);
  std::__cxx11::string::_M_assign((string *)&(e->super_Definition).doc_comment);
  e->is_union = is_union;
  bVar5 = SymbolTable<flatbuffers::EnumDef>::Add(&this->enums_,(string *)&local_98,e);
  if (bVar5) goto LAB_0010e808;
  if (is_union) {
    (e->underlying_type).base_type = BASE_TYPE_UTYPE;
    (e->underlying_type).enum_def = e;
  }
  else {
    type = &e->underlying_type;
    if (this->token_ == 0x3a) {
      Next(this);
      ParseType(this,type);
      if (type->base_type - BASE_TYPE_UTYPE < 10) goto LAB_0010e4dd;
      e = (EnumDef *)(local_d8 + 0x10);
      local_d8._0_8_ = e;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"underlying enum type must be integral","");
      Error((string *)local_d8);
    }
    type->base_type = BASE_TYPE_SHORT;
  }
LAB_0010e4dd:
  ParseMetaData(this,&e->super_Definition);
  Expect(this,0x7b);
  if (is_union) {
    local_d8._0_8_ = local_d8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"NONE","");
    pEVar6 = (EnumVal *)operator_new(0x50);
    local_b8._M_allocated_capacity = (size_type)local_a8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"NONE","");
    (pEVar6->name)._M_dataplus._M_p = (pointer)&(pEVar6->name).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pEVar6,local_b8._M_allocated_capacity,
               (undefined1 *)(local_b8._8_8_ + local_b8._M_allocated_capacity));
    (pEVar6->doc_comment)._M_dataplus._M_p = (pointer)&(pEVar6->doc_comment).field_2;
    (pEVar6->doc_comment)._M_string_length = 0;
    (pEVar6->doc_comment).field_2._M_local_buf[0] = '\0';
    pEVar6->value = 0;
    pEVar6->struct_def = (StructDef *)0x0;
    SymbolTable<flatbuffers::EnumVal>::Add(&e->vals,(string *)local_d8,pEVar6);
    if ((undefined1 *)local_b8._M_allocated_capacity != local_a8) {
      operator_delete((void *)local_b8._M_allocated_capacity);
    }
    if ((undefined1 *)local_d8._0_8_ != local_d8 + 0x10) {
      operator_delete((void *)local_d8._0_8_);
    }
  }
  local_78 = &e->vals;
  while( true ) {
    local_d8._0_8_ = local_d8 + 0x10;
    pcVar2 = (this->attribute_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_d8,pcVar2,pcVar2 + (this->attribute_)._M_string_length);
    local_b8._M_allocated_capacity = (size_type)local_a8;
    pcVar2 = (this->doc_comment_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b8,pcVar2,pcVar2 + (this->doc_comment_)._M_string_length);
    Expect(this,4);
    ppEVar3 = (e->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    ppEVar4 = (e->vals).vec.
              super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    pEVar6 = (EnumVal *)operator_new(0x50);
    if (ppEVar4 == ppEVar3) {
      iVar8 = 0;
    }
    else {
      iVar8 = ppEVar4[-1]->value + 1;
    }
    (pEVar6->name)._M_dataplus._M_p = (pointer)&(pEVar6->name).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)pEVar6,local_d8._0_8_,(pointer)(local_d8._0_8_ + local_d8._8_8_));
    (pEVar6->doc_comment)._M_dataplus._M_p = (pointer)&(pEVar6->doc_comment).field_2;
    (pEVar6->doc_comment)._M_string_length = 0;
    (pEVar6->doc_comment).field_2._M_local_buf[0] = '\0';
    pEVar6->value = iVar8;
    pEVar6->struct_def = (StructDef *)0x0;
    bVar5 = SymbolTable<flatbuffers::EnumVal>::Add(local_78,(string *)local_d8,pEVar6);
    if (bVar5) break;
    std::__cxx11::string::_M_assign((string *)&pEVar6->doc_comment);
    if (is_union) {
      pSVar7 = LookupCreateStruct(this,(string *)local_d8);
      pEVar6->struct_def = pSVar7;
    }
    if (this->token_ == 0x3d) {
      Next(this);
      iVar8 = atoi((this->attribute_)._M_dataplus._M_p);
      pEVar6->value = iVar8;
      Expect(this,2);
      if ((ppEVar4 != ppEVar3) &&
         (pEVar6->value <=
          *(int *)(*(long *)((long)ppEVar4 +
                            (long)(e->vals).vec.
                                  super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start + (-8 - (long)ppEVar3))
                  + 0x40))) goto LAB_0010e7da;
    }
    if ((undefined1 *)local_b8._M_allocated_capacity != local_a8) {
      operator_delete((void *)local_b8._M_allocated_capacity);
    }
    if ((EnumDef *)local_d8._0_8_ != (EnumDef *)(local_d8 + 0x10)) {
      operator_delete((void *)local_d8._0_8_);
    }
    if (this->token_ != 0x2c) {
      Expect(this,0x7d);
      if ((char *)local_98._M_allocated_capacity != local_88) {
        operator_delete((void *)local_98._M_allocated_capacity);
      }
      if ((Value **)local_50._M_allocated_capacity != local_40) {
        operator_delete((void *)local_50._M_allocated_capacity);
      }
      return;
    }
    Next(this);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 "enum value already exists: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
  Error((string *)local_70);
LAB_0010e7da:
  e = (EnumDef *)(local_70 + 0x10);
  local_70._0_8_ = e;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_70,"enum values must be specified in ascending order","");
  Error((string *)local_70);
LAB_0010e808:
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8,
                 "enum already exists: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
  Error((string *)local_d8);
  if ((EnumDef *)local_d8._0_8_ != e) {
    operator_delete((void *)local_d8._0_8_);
  }
  if ((char *)local_98._M_allocated_capacity != local_88) {
    operator_delete((void *)local_98._M_allocated_capacity);
  }
  if ((Value **)local_50._M_allocated_capacity != local_40) {
    operator_delete((void *)local_50._M_allocated_capacity);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Parser::ParseEnum(bool is_union) {
  std::string dc = doc_comment_;
  Next();
  std::string name = attribute_;
  Expect(kTokenIdentifier);
  auto &enum_def = *new EnumDef();
  enum_def.name = name;
  enum_def.doc_comment = dc;
  enum_def.is_union = is_union;
  if (enums_.Add(name, &enum_def)) Error("enum already exists: " + name);
  if (is_union) {
    enum_def.underlying_type.base_type = BASE_TYPE_UTYPE;
    enum_def.underlying_type.enum_def = &enum_def;
  } else if (IsNext(':')) {
    // short is the default type for fields when you use enums,
    // though people are encouraged to pick any integer type instead.
    ParseType(enum_def.underlying_type);
    if (!IsInteger(enum_def.underlying_type.base_type))
      Error("underlying enum type must be integral");
  } else {
    enum_def.underlying_type.base_type = BASE_TYPE_SHORT;
  }
  ParseMetaData(enum_def);
  Expect('{');
  if (is_union) enum_def.vals.Add("NONE", new EnumVal("NONE", 0));
  do {
    std::string name = attribute_;
    std::string dc = doc_comment_;
    Expect(kTokenIdentifier);
    auto prevsize = enum_def.vals.vec.size();
    auto &ev = *new EnumVal(name, static_cast<int>(
                      enum_def.vals.vec.size()
                        ? enum_def.vals.vec.back()->value + 1
                        : 0));
    if (enum_def.vals.Add(name, &ev))
      Error("enum value already exists: " + name);
    ev.doc_comment = dc;
    if (is_union) {
      ev.struct_def = LookupCreateStruct(name);
    }
    if (IsNext('=')) {
      ev.value = atoi(attribute_.c_str());
      Expect(kTokenIntegerConstant);
      if (prevsize && enum_def.vals.vec[prevsize - 1]->value >= ev.value)
        Error("enum values must be specified in ascending order");
    }
  } while (IsNext(','));
  Expect('}');
}